

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O2

void __thiscall hwnet::TCPConnector::Do(TCPConnector *this)

{
  int __args;
  undefined1 auStack_68 [8];
  ConnectCallback connectCallback;
  ErrorCallback errorCallback;
  
  connectCallback.super__Function_base._M_functor._8_8_ = 0;
  connectCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_68 = (undefined1  [8])0x0;
  connectCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  connectCallback._M_invoker = (_Invoker_type)0x0;
  std::mutex::lock(&this->mtx);
  if (this->gotError == true) {
    std::function<void_(int,_const_hwnet::Addr_&)>::operator=
              ((function<void_(int,_const_hwnet::Addr_&)> *)&connectCallback._M_invoker,
               &this->errorCallback_);
    close(this->fd);
    __args = -1;
  }
  else {
    std::function<void_(int)>::operator=((function<void_(int)> *)auStack_68,&this->connectCallback_)
    ;
    __args = this->fd;
    this->fd = -1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  if (connectCallback.super__Function_base._M_functor._8_8_ != 0) {
    std::function<void_(int)>::operator()((function<void_(int)> *)auStack_68,__args);
  }
  std::_Function_base::~_Function_base((_Function_base *)&connectCallback._M_invoker);
  std::_Function_base::~_Function_base((_Function_base *)auStack_68);
  return;
}

Assistant:

void TCPConnector::Do() {
	int fd_ = -1;
	ConnectCallback connectCallback = nullptr;
	ErrorCallback   errorCallback = nullptr;

	{
		std::lock_guard<std::mutex> guard(this->mtx);
		if(this->gotError) {
			errorCallback = this->errorCallback_;
			::close(this->fd);
		} else {	
			connectCallback = this->connectCallback_;
			fd_ = this->fd;
			this->fd = -1;
		}
	}

	if(nullptr != errorCallback) {
		errorCallback(this->err,this->remoteAddr);
	} else if(nullptr != connectCallback) {
		connectCallback(fd_);
	}
}